

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

string * EncodeBase32_abi_cxx11_
                   (string *__return_storage_ptr__,Span<const_unsigned_char> input,bool pad)

{
  ulong uVar1;
  size_t bits;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  long in_FS_OFFSET;
  anon_class_8_1_ba1d7991 local_40;
  long local_38;
  
  pbVar4 = input.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,((input.m_size + 4) / 5) * 8);
  pbVar3 = pbVar4 + input.m_size;
  uVar2 = 0;
  uVar1 = 0;
  local_40.str = __return_storage_ptr__;
  for (; pbVar4 != pbVar3; pbVar4 = pbVar4 + 1) {
    uVar1 = (ulong)(((uint)uVar1 & 0xf) << 8) | (ulong)*pbVar4;
    uVar2 = uVar2 + 8;
    while (4 < uVar2) {
      uVar2 = uVar2 - 5;
      EncodeBase32::anon_class_8_1_ba1d7991::operator()
                (&local_40,(uint)(uVar1 >> ((byte)uVar2 & 0x3f)) & 0x1f);
    }
  }
  if (uVar2 != 0) {
    EncodeBase32::anon_class_8_1_ba1d7991::operator()
              (&local_40,(uint)uVar1 << (5U - (char)uVar2 & 0x1f) & 0x1f);
  }
  if (pad) {
    while ((__return_storage_ptr__->_M_string_length & 7) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'=');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase32(Span<const unsigned char> input, bool pad)
{
    static const char *pbase32 = "abcdefghijklmnopqrstuvwxyz234567";

    std::string str;
    str.reserve(((input.size() + 4) / 5) * 8);
    ConvertBits<8, 5, true>([&](int v) { str += pbase32[v]; }, input.begin(), input.end());
    if (pad) {
        while (str.size() % 8) {
            str += '=';
        }
    }
    return str;
}